

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

PropertyDescriptor *
Js::JavascriptOperators::FillMissingPropertyDescriptorFields<false>
          (PropertyDescriptor *__return_storage_ptr__,PropertyDescriptor *descriptor,
          ScriptContext *scriptContext)

{
  bool bVar1;
  JavascriptLibrary *this;
  PropertyDescriptor *this_00;
  undefined1 local_4b;
  undefined1 local_4a;
  undefined1 local_49;
  undefined8 local_48;
  PropertyDescriptor *defaultDescriptor;
  ScriptContext *scriptContext_local;
  PropertyDescriptor *descriptor_local;
  PropertyDescriptor *newDescriptor;
  
  PropertyDescriptor::PropertyDescriptor(__return_storage_ptr__);
  this = ScriptContext::GetLibrary(scriptContext);
  this_00 = JavascriptLibrary::GetDefaultPropertyDescriptor(this);
  bVar1 = PropertyDescriptor::ValueSpecified(descriptor);
  if (bVar1) {
    local_48 = PropertyDescriptor::GetValue(descriptor);
  }
  else {
    local_48 = PropertyDescriptor::GetValue(this_00);
  }
  PropertyDescriptor::SetValue(__return_storage_ptr__,local_48);
  bVar1 = PropertyDescriptor::WritableSpecified(descriptor);
  if (bVar1) {
    local_49 = PropertyDescriptor::IsWritable(descriptor);
  }
  else {
    local_49 = PropertyDescriptor::IsWritable(this_00);
  }
  PropertyDescriptor::SetWritable(__return_storage_ptr__,local_49);
  bVar1 = PropertyDescriptor::ConfigurableSpecified(descriptor);
  if (bVar1) {
    local_4a = PropertyDescriptor::IsConfigurable(descriptor);
  }
  else {
    local_4a = PropertyDescriptor::IsConfigurable(this_00);
  }
  PropertyDescriptor::SetConfigurable(__return_storage_ptr__,local_4a);
  bVar1 = PropertyDescriptor::EnumerableSpecified(descriptor);
  if (bVar1) {
    local_4b = PropertyDescriptor::IsEnumerable(descriptor);
  }
  else {
    local_4b = PropertyDescriptor::IsEnumerable(this_00);
  }
  PropertyDescriptor::SetEnumerable(__return_storage_ptr__,local_4b);
  return __return_storage_ptr__;
}

Assistant:

PropertyDescriptor JavascriptOperators::FillMissingPropertyDescriptorFields(PropertyDescriptor descriptor, ScriptContext* scriptContext)
    {
        PropertyDescriptor newDescriptor;
        const PropertyDescriptor* defaultDescriptor = scriptContext->GetLibrary()->GetDefaultPropertyDescriptor();
        if (isAccessor)
        {
            newDescriptor.SetGetter(descriptor.GetterSpecified() ? descriptor.GetGetter() : defaultDescriptor->GetGetter());
            newDescriptor.SetSetter(descriptor.SetterSpecified() ? descriptor.GetSetter() : defaultDescriptor->GetSetter());
        }
        else
        {
            newDescriptor.SetValue(descriptor.ValueSpecified() ? descriptor.GetValue() : defaultDescriptor->GetValue());
            newDescriptor.SetWritable(descriptor.WritableSpecified() ? descriptor.IsWritable() : defaultDescriptor->IsWritable());
        }
        newDescriptor.SetConfigurable(descriptor.ConfigurableSpecified() ? descriptor.IsConfigurable() : defaultDescriptor->IsConfigurable());
        newDescriptor.SetEnumerable(descriptor.EnumerableSpecified() ? descriptor.IsEnumerable() : defaultDescriptor->IsEnumerable());
        return newDescriptor;
    }